

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O0

iterator __thiscall bloaty::RangeMap::FindContainingOrAfter(RangeMap *this,uint64_t addr)

{
  bool bVar1;
  RangeMap *in_RSI;
  _Base_ptr in_RDI;
  iterator it;
  iterator after;
  uint7 in_stack_ffffffffffffffc0;
  bool bVar2;
  _Self local_30;
  _Self local_28;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> iter;
  _Base_ptr local_8;
  
  iter._M_node = in_RDI;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
       ::upper_bound(in_RDI,(key_type *)0x1de4b1);
  local_8 = local_28._M_node;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
       ::begin(in_RDI);
  bVar1 = std::operator!=(&local_28,&local_30);
  bVar2 = false;
  if (bVar1) {
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::operator--
              ((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
               (ulong)in_stack_ffffffffffffffc0);
    bVar2 = EntryContains<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                      (in_RSI,iter,(uint64_t)local_8);
  }
  if (bVar2 != false) {
    local_8 = local_28._M_node;
  }
  return (iterator)local_8;
}

Assistant:

RangeMap::Map::iterator RangeMap::FindContainingOrAfter(uint64_t addr) {
  auto after = mappings_.upper_bound(addr);
  auto it = after;
  if (it != mappings_.begin() && (--it, EntryContains(it, addr))) {
    return it;  // Containing
  } else {
    return after;  // May be end().
  }
}